

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_params.c
# Opt level: O1

void main_cold_3(void)

{
  ERR_print_errors_fp(_stderr);
  fprintf(_stderr,"Error at %s:%d %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_params.c",
          0x396,"xk = X509_get_X509_PUBKEY(x)");
  return;
}

Assistant:

static int test_cert(struct test_cert *tc)
{
    int ret = 0, err;
    X509 *x;
    const unsigned char *p;

    printf(cBLUE "Test %s (it): " cNORM, tc->name);
    p = tc->cert;
    T(x = d2i_X509(NULL, &p, tc->len));

    X509_PUBKEY *xk;
    TE(xk = X509_get_X509_PUBKEY(x));

    /* Output algo and parameters. */
    X509_ALGOR *palg;
    ASN1_OBJECT *ppkalg;
    T(X509_PUBKEY_get0_param(&ppkalg, NULL, 0, &palg, xk));
    int algo_nid = OBJ_obj2nid(ppkalg);
    printf(" (algo %s)", OBJ_nid2sn(algo_nid));
    int pptype;
    ASN1_STRING *pval = NULL;
    X509_ALGOR_get0(NULL, &pptype, (void *)&pval, palg);

    /* Low level access to parameters in case X509_get0_pubkey does not work. */
    T(pptype == V_ASN1_SEQUENCE);
    STACK_OF(ASN1_TYPE) *seq;
    p = pval->data;
    T(seq = d2i_ASN1_SEQUENCE_ANY(NULL, &p, pval->length));
    ASN1_TYPE *p1; /* First parameter is curve OID. */
    T(p1 = sk_ASN1_TYPE_value(seq, 0));
    int param_nid = OBJ_obj2nid((ASN1_OBJECT *)(p1->value.ptr));
    printf(" (curve %s)\n", OBJ_nid2sn(param_nid));
    sk_ASN1_TYPE_pop_free(seq, ASN1_TYPE_free);

    /*
     * Conversion tests.
     */
    /* Convert cert to DER and back. */
    BIO *bp;
    T(bp = BIO_new(BIO_s_mem()));
    T(i2d_X509_bio(bp, x));
    X509 *y = NULL;
    T(d2i_X509_bio(bp, &y));
    err = X509_cmp(x, y);
    printf("  d2i_X509_bio\t\t\t");
    print_test_result(!err);
    ret |= err;
    X509_free(y);

    /* Convert cert to PEM and back. */
    y = NULL;
    T(PEM_write_bio_X509(bp, x));
    T(PEM_read_bio_X509(bp, &y, 0, NULL));
    err = X509_cmp(x, y);
    printf("  PEM_read_bio_X509\t\t");
    print_test_result(!err);
    ret |= err;
    X509_free(y);

    /* Convert public key to PEM and back. */
    T(BIO_reset(bp));
    T(PEM_write_bio_X509_PUBKEY(bp, xk));
    X509_PUBKEY *tk = NULL;
    T(PEM_read_bio_X509_PUBKEY(bp, &tk, NULL, NULL));
    err = X509_PUBKEY_cmp(xk, tk);
    X509_PUBKEY_free(tk);
    printf("  PEM_read_bio_X509_PUBKEY\t");
    print_test_result(!err);
    ret |= err;

    /* Convert public key to DER and back. */
    T(BIO_reset(bp));
    T(i2d_X509_PUBKEY_bio(bp, xk));
    tk = NULL;
    T(d2i_X509_PUBKEY_bio(bp, &tk));
    err = X509_PUBKEY_cmp(xk, tk);
    X509_PUBKEY_free(tk);
    printf("  d2i_X509_PUBKEY_bio\t\t");
    print_test_result(!err);
    ret |= err;
    BIO_free(bp);

    /*
     * Verify
     */
    printf("  X509_verify API\t\t");
    fflush(stdout);
    EVP_PKEY *pk;
    TE(pk = X509_get0_pubkey(x));
    /* Similar to: openssl verify -partial_chain -check_ss_sig ... */
    /* X509_verify uses EVP_DigestVerify internally */
    err = X509_verify(x, pk);
    print_test_result(err);
    ret |= err != 1;

    /* Verify manually. */
    const ASN1_BIT_STRING *signature;
    X509_get0_signature(&signature, NULL, x);
    unsigned char *tbs = NULL; /* signed part */
    int tbs_len;
    T((tbs_len = i2d_re_X509_tbs(x, &tbs)) > 0);
    int algnid, hash_nid, pknid;
    T(algnid = X509_get_signature_nid(x));
    T(OBJ_find_sigid_algs(algnid, &hash_nid, &pknid));

    printf("  EVP_Verify API\t\t");
    EVP_MD_CTX *md_ctx;
    T(md_ctx = EVP_MD_CTX_new());
    const EVP_MD *mdtype;
    T(mdtype = EVP_get_digestbynid(hash_nid));
    T(EVP_VerifyInit(md_ctx, mdtype));
    T(EVP_VerifyUpdate(md_ctx, tbs, tbs_len));
    err = EVP_VerifyFinal(md_ctx, signature->data, signature->length, pk);
    print_test_result(err);
    EVP_MD_CTX_free(md_ctx);
    ret |= err != 1;

    X509_free(x);
    OPENSSL_free(tbs);
    return ret;
}